

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionEval.cpp
# Opt level: O2

ExprBase * EvaluateFunctionCall(ExpressionEvalContext *ctx,ExprFunctionCall *expression)

{
  Allocator *pAVar1;
  SynBase *pSVar2;
  TypeBase *pTVar3;
  FunctionData *data;
  ExprFunctionDefinition *expression_00;
  bool bVar4;
  int iVar5;
  uint uVar6;
  StackFrame **ppSVar7;
  undefined4 extraout_var;
  ExprFunctionLiteral *ptr;
  SynIdentifier *pSVar8;
  ExprBase *pEVar9;
  IntrusiveList<ExprBase> *pIVar10;
  ArrayView<ExprBase_*> arguments_00;
  ArrayView<ExprBase_*> arguments_01;
  ExprBase *value;
  SmallArray<ExprBase_*,_8U> arguments;
  
  if (((ctx->stackFrames).count != 0) &&
     (ppSVar7 = SmallArray<ExpressionEvalContext::StackFrame_*,_32U>::back(&ctx->stackFrames),
     (*ppSVar7)->targetYield != 0)) {
    pAVar1 = ctx->ctx->allocator;
    iVar5 = (*pAVar1->_vptr_Allocator[2])(pAVar1,0x30);
    pEVar9 = (ExprBase *)CONCAT44(extraout_var,iVar5);
    pSVar2 = (expression->super_ExprBase).source;
    pTVar3 = ctx->ctx->typeVoid;
    pEVar9->typeID = 2;
    pEVar9->source = pSVar2;
    pEVar9->type = pTVar3;
    pEVar9->next = (ExprBase *)0x0;
    pEVar9->listed = false;
    pEVar9->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_00240668;
    return pEVar9;
  }
  bVar4 = AddInstruction(ctx);
  if ((!bVar4) ||
     (ptr = (ExprFunctionLiteral *)Evaluate(ctx,expression->function),
     ptr == (ExprFunctionLiteral *)0x0)) {
    return (ExprBase *)0x0;
  }
  arguments.allocator = ctx->ctx->allocator;
  arguments.data = arguments.little;
  arguments.count = 0;
  arguments.max = 8;
  pIVar10 = &expression->arguments;
  while (pEVar9 = pIVar10->head, pEVar9 != (ExprBase *)0x0) {
    value = Evaluate(ctx,pEVar9);
    if (value == (ExprBase *)0x0) goto LAB_0014a748;
    SmallArray<ExprBase_*,_8U>::push_back(&arguments,&value);
    pIVar10 = (IntrusiveList<ExprBase> *)&pEVar9->next;
  }
  if ((ptr->super_ExprBase).typeID == 0xb) {
    data = ptr->data;
    if (data == (FunctionData *)0x0) {
      pEVar9 = (ExprBase *)0x0;
      Report(ctx,"ERROR: null function pointer call");
      goto LAB_0014a74b;
    }
    expression_00 = (ExprFunctionDefinition *)data->declaration;
    if (expression_00 == (ExprFunctionDefinition *)0x0) {
      if (((ctx->emulateKnownExternals == true) &&
          (uVar6 = ExpressionContext::GetFunctionIndex(ctx->ctx,data),
          uVar6 < ctx->ctx->baseModuleFunctionCount)) &&
         (arguments_00.count = arguments.count, arguments_00.data = arguments.data,
         arguments_00._12_4_ = 0,
         pEVar9 = EvaluateKnownExternalFunctionCall(ctx,expression,ptr,arguments_00),
         pEVar9 != (ExprBase *)0x0)) goto LAB_0014a74b;
      pSVar8 = ptr->data->name;
    }
    else {
      if (data->isPrototype != true) {
        if ((expression_00->super_ExprBase).typeID != 0x24) {
          __assert_fail("declaration",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionEval.cpp"
                        ,0xad2,
                        "ExprBase *EvaluateFunctionCall(ExpressionEvalContext &, ExprFunctionCall *)"
                       );
        }
        uVar6 = IntrusiveList<ExprVariableDefinition>::size(&expression_00->arguments);
        if ((uVar6 == arguments.count) &&
           (arguments_01.count = uVar6, arguments_01.data = arguments.data, arguments_01._12_4_ = 0,
           pEVar9 = EvaluateFunction(ctx,expression_00,ptr->context,arguments_01),
           pEVar9 != (ExprBase *)0x0)) {
          pEVar9 = CheckType(&expression->super_ExprBase,pEVar9);
          goto LAB_0014a74b;
        }
        goto LAB_0014a748;
      }
      pSVar8 = data->name;
    }
    pEVar9 = (ExprBase *)0x0;
    Report(ctx,"ERROR: function \'%.*s\' has no source",
           (ulong)(uint)(*(int *)&(pSVar8->name).end - (int)(pSVar8->name).begin));
  }
  else {
LAB_0014a748:
    pEVar9 = (ExprBase *)0x0;
  }
LAB_0014a74b:
  SmallArray<ExprBase_*,_8U>::~SmallArray(&arguments);
  return pEVar9;
}

Assistant:

ExprBase* EvaluateFunctionCall(ExpressionEvalContext &ctx, ExprFunctionCall *expression)
{
	if(!ctx.stackFrames.empty() && ctx.stackFrames.back()->targetYield)
		return new (ctx.ctx.get<ExprVoid>()) ExprVoid(expression->source, ctx.ctx.typeVoid);

	if(!AddInstruction(ctx))
		return NULL;
	
	ExprBase *function = Evaluate(ctx, expression->function);

	if(!function)
		return NULL;

	SmallArray<ExprBase*, 8> arguments(ctx.ctx.allocator);

	for(ExprBase *curr = expression->arguments.head; curr; curr = curr->next)
	{
		ExprBase *value = Evaluate(ctx, curr);

		if(!value)
			return NULL;

		arguments.push_back(value);
	}

	ExprFunctionLiteral *ptr = getType<ExprFunctionLiteral>(function);

	if(!ptr)
		return NULL;

	if(!ptr->data)
		return Report(ctx, "ERROR: null function pointer call");

	if(!ptr->data->declaration)
	{
		if(ctx.emulateKnownExternals && ctx.ctx.GetFunctionIndex(ptr->data) < ctx.ctx.baseModuleFunctionCount)
		{
			if(ExprBase *result = EvaluateKnownExternalFunctionCall(ctx, expression, ptr, arguments))
				return result;
		}

		return Report(ctx, "ERROR: function '%.*s' has no source", FMT_ISTR(ptr->data->name->name));
	}

	if(ptr->data->isPrototype)
		return Report(ctx, "ERROR: function '%.*s' has no source", FMT_ISTR(ptr->data->name->name));

	ExprFunctionDefinition *declaration = getType<ExprFunctionDefinition>(ptr->data->declaration);

	assert(declaration);

	if(declaration->arguments.size() != arguments.size())
		return NULL;

	ExprBase *call = EvaluateFunction(ctx, declaration, ptr->context, arguments);

	if(!call)
		return NULL;

	return CheckType(expression, call);
}